

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

void arkFreeVectors(ARKodeMem ark_mem)

{
  arkFreeVec(ark_mem,&ark_mem->ewt);
  if (ark_mem->rwt_is_ewt == 0) {
    arkFreeVec(ark_mem,&ark_mem->rwt);
  }
  arkFreeVec(ark_mem,&ark_mem->tempv1);
  arkFreeVec(ark_mem,&ark_mem->tempv2);
  arkFreeVec(ark_mem,&ark_mem->tempv3);
  arkFreeVec(ark_mem,&ark_mem->tempv4);
  arkFreeVec(ark_mem,&ark_mem->tempv5);
  arkFreeVec(ark_mem,&ark_mem->yn);
  arkFreeVec(ark_mem,&ark_mem->fn);
  arkFreeVec(ark_mem,&ark_mem->Vabstol);
  arkFreeVec(ark_mem,&ark_mem->constraints);
  return;
}

Assistant:

void arkFreeVectors(ARKodeMem ark_mem)
{
  arkFreeVec(ark_mem, &ark_mem->ewt);
  if (!ark_mem->rwt_is_ewt) { arkFreeVec(ark_mem, &ark_mem->rwt); }
  arkFreeVec(ark_mem, &ark_mem->tempv1);
  arkFreeVec(ark_mem, &ark_mem->tempv2);
  arkFreeVec(ark_mem, &ark_mem->tempv3);
  arkFreeVec(ark_mem, &ark_mem->tempv4);
  arkFreeVec(ark_mem, &ark_mem->tempv5);
  arkFreeVec(ark_mem, &ark_mem->yn);
  arkFreeVec(ark_mem, &ark_mem->fn);
  arkFreeVec(ark_mem, &ark_mem->Vabstol);
  arkFreeVec(ark_mem, &ark_mem->constraints);
}